

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O1

void __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::Destruct
          (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this)

{
  void *ptr;
  IMemoryAllocator *Allocator;
  long lVar1;
  long lVar2;
  ulong uVar3;
  string msg;
  string local_40;
  
  if (this->m_IsDestructed == true) {
    FormatString<char[40]>(&local_40,(char (*) [40])"This object has already been destructed");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"Destruct",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
               ,0x3d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  (this->
  super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
  ).m_Desc.Resources = (PipelineResourceDesc *)0x0;
  (this->
  super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
  ).m_Desc.ImmutableSamplers = (ImmutableSamplerDesc *)0x0;
  (this->
  super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
  ).m_Desc.CombinedSamplerSuffix = (Char *)0x0;
  Allocator = GetRawAllocator();
  if (this->m_StaticVarsMgrs != (ShaderVariableManagerImplType *)0x0) {
    lVar2 = -6;
    do {
      lVar1 = (long)*(char *)((long)(&this->m_StaticResStageIndex + 1) + lVar2);
      if (-1 < lVar1) {
        ShaderVariableManagerVk::Destroy(this->m_StaticVarsMgrs + lVar1,Allocator);
        ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>::
        ~ShaderVariableManagerBase
                  (&this->m_StaticVarsMgrs[lVar1].
                    super_ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>
                  );
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0);
    this->m_StaticVarsMgrs = (ShaderVariableManagerImplType *)0x0;
  }
  if (this->m_pStaticResCache != (ShaderResourceCacheVk *)0x0) {
    ShaderResourceCacheVk::~ShaderResourceCacheVk(this->m_pStaticResCache);
    this->m_pStaticResCache = (ShaderResourceCacheImplType *)0x0;
  }
  (this->m_StaticResStageIndex)._M_elems[4] = -1;
  (this->m_StaticResStageIndex)._M_elems[5] = -1;
  (this->m_StaticResStageIndex)._M_elems[0] = -1;
  (this->m_StaticResStageIndex)._M_elems[1] = -1;
  (this->m_StaticResStageIndex)._M_elems[2] = -1;
  (this->m_StaticResStageIndex)._M_elems[3] = -1;
  this->m_pResourceAttribs = (PipelineResourceAttribsType *)0x0;
  this->m_pImmutableSamplerAttribs = (ImmutableSamplerAttribsType *)0x0;
  if ((this->m_pImmutableSamplers != (RefCntAutoPtr<Diligent::SamplerVkImpl> *)0x0) &&
     ((this->
      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
      ).m_Desc.NumImmutableSamplers != 0)) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      RefCntAutoPtr<Diligent::SamplerVkImpl>::Release
                ((RefCntAutoPtr<Diligent::SamplerVkImpl> *)
                 ((long)&this->m_pImmutableSamplers->m_pObject + lVar2));
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 8;
    } while (uVar3 < (this->
                     super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                     ).m_Desc.NumImmutableSamplers);
  }
  ptr = (this->m_pRawMemory)._M_t.
        super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
        super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
        super__Head_base<0UL,_void_*,_false>._M_head_impl;
  (this->m_pRawMemory)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = (void *)0x0;
  if (ptr != (void *)0x0) {
    STDDeleter<void,_Diligent::IMemoryAllocator>::operator()
              ((STDDeleter<void,_Diligent::IMemoryAllocator> *)&this->m_pRawMemory,ptr);
  }
  this->m_IsDestructed = true;
  return;
}

Assistant:

void Destruct()
    {
        VERIFY(!m_IsDestructed, "This object has already been destructed");

        this->m_Desc.Resources             = nullptr;
        this->m_Desc.ImmutableSamplers     = nullptr;
        this->m_Desc.CombinedSamplerSuffix = nullptr;

        IMemoryAllocator& RawAllocator = GetRawAllocator();

        if (m_StaticVarsMgrs != nullptr)
        {
            for (int Idx : m_StaticResStageIndex)
            {
                if (Idx >= 0)
                {
                    m_StaticVarsMgrs[Idx].Destroy(RawAllocator);
                    m_StaticVarsMgrs[Idx].~ShaderVariableManagerImplType();
                }
            }
            m_StaticVarsMgrs = nullptr;
        }

        if (m_pStaticResCache != nullptr)
        {
            m_pStaticResCache->~ShaderResourceCacheImplType();
            m_pStaticResCache = nullptr;
        }

        m_StaticResStageIndex.fill(-1);

        static_assert(std::is_trivially_destructible<PipelineResourceAttribsType>::value, "Destructors for m_pResourceAttribs[] are required");
        m_pResourceAttribs = nullptr;
        static_assert(std::is_trivially_destructible<ImmutableSamplerAttribsType>::value, "Destructors for m_pImmutableSamplerAttribs[] are required");
        m_pImmutableSamplerAttribs = nullptr;

        if (m_pImmutableSamplers != nullptr)
        {
            for (size_t i = 0; i < this->m_Desc.NumImmutableSamplers; ++i)
                m_pImmutableSamplers[i].~RefCntAutoPtr<SamplerImplType>();
        }

        m_pRawMemory.reset();

#if DILIGENT_DEBUG
        m_IsDestructed = true;
#endif
    }